

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

queue_item * cod_find_index_abs(ev_state_data *ev_state,int queue,int index)

{
  queue_item *pqVar1;
  queue_item *pqVar2;
  
  pqVar1 = queue_find_index(ev_state->queue->queue_head,index,(FMFormat)0x0);
  pqVar2 = (queue_item *)0x0;
  if (((pqVar1 != (queue_item *)0x0) && (pqVar2 = pqVar1, -1 < queue)) &&
     (pqVar2 = (queue_item *)0x0,
     pqVar1->item->reference_format ==
     *(FMFormat *)((long)(ev_state->instance->u).transform.client_data + (ulong)(uint)queue * 8))) {
    pqVar2 = pqVar1;
  }
  return pqVar2;
}

Assistant:

static queue_item *cod_find_index_abs(struct ev_state_data *ev_state, int queue, int index) {
    queue_item *ret;
    ret = queue_find_index(ev_state->queue->queue_head, index, NULL);
    if (!ret)
        return NULL;
    if (queue < 0 || ret->item->reference_format ==
            ev_state->instance->u.queued.formats[queue])
        return ret;
    else
        return NULL;
}